

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

uint8_t __thiscall cfd::core::AddressFormatData::GetP2shPrefix(AddressFormatData *this)

{
  uint32_t uVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"p2sh","");
  uVar1 = GetValue(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return (uint8_t)uVar1;
}

Assistant:

uint8_t AddressFormatData::GetP2shPrefix() const {
  return static_cast<uint8_t>(GetValue(kPrefixP2sh));
}